

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int get_status(igsc_device_handle *handle)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint8_t result;
  uint8_t tiles_num;
  uint32_t ifr_applied;
  uint32_t supported_tests;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  supported_tests = 0;
  ifr_applied = 0;
  tiles_num = '\0';
  result = '\0';
  iVar2 = 3;
  do {
    uVar1 = igsc_ifr_get_status(handle,&result,&supported_tests,&ifr_applied,&tiles_num);
    if (uVar1 != 0xd) break;
    usleep(2000000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (result == '\0' && uVar1 == 0) {
    iVar2 = 0;
    printf("Number of tiles: %u\n",(ulong)tiles_num);
    printf("Supported tests: scan_test: %u, array test: %u\n",(ulong)(supported_tests & 1),
           (ulong)(supported_tests >> 1 & 1));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",(ulong)(ifr_applied & 1),
           (ulong)(ifr_applied >> 1 & 1));
  }
  else {
    if (quiet == '\0') {
      fprintf(_stderr,"Error: Failed to get ifr status, library return code %d, command result %u\n"
              ,(ulong)uVar1,(ulong)result);
    }
    print_device_fw_status(handle);
    iVar2 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

mockable_static
int get_status(struct igsc_device_handle *handle)
{
    int      ret;
    uint32_t supported_tests = 0;
    uint32_t ifr_applied = 0;
    uint8_t  tiles_num = 0;
    uint8_t  result = 0;
    unsigned int retries = 0;

    /* call the igsc library routine to get the ifr status */
    while ((ret = igsc_ifr_get_status(handle, &result, &supported_tests, &ifr_applied, &tiles_num)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret || result)
    {
        fwupd_error("Failed to get ifr status, library return code %d, command result %u\n",
                    ret, result);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of tiles: %u\n", tiles_num);
    printf("Supported tests: scan_test: %u, array test: %u\n",
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_SCAN),
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_ARRAY));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",
           !!(ifr_applied & IGSC_IFR_REPAIR_DSS_EN),
           !!(ifr_applied &IGSC_IFR_REPAIR_ARRAY));

    return ret;
}